

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

bool __thiscall LowererMDArch::GenerateFastDivAndRem_Signed(LowererMDArch *this,Instr *instrDiv)

{
  Opnd *dst;
  Opnd *src1;
  uint uVar1;
  code *pcVar2;
  uint divisor;
  bool bVar3;
  OpndKind OVar4;
  uint uVar5;
  undefined4 *puVar6;
  RegOpnd *dst_00;
  JITTimeFunctionBody *this_00;
  RegOpnd *pRVar7;
  RegOpnd *dst_01;
  Instr *instr;
  IntConstOpnd *pIVar8;
  ulong value;
  DivMagicNumber DVar9;
  
  if ((instrDiv->m_opcode != Div_I4) && (instrDiv->m_opcode != Rem_I4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb6c,
                       "(instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4)"
                       ,
                       "instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4"
                      );
    if (!bVar3) goto LAB_00649908;
    *puVar6 = 0;
  }
  dst = instrDiv->m_dst;
  src1 = instrDiv->m_src1;
  pIVar8 = (IntConstOpnd *)instrDiv->m_src2;
  OVar4 = IR::Opnd::GetKind((Opnd *)pIVar8);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_00649908;
    *puVar6 = 0;
  }
  uVar5 = IR::IntConstOpnd::AsInt32(pIVar8);
  dst_00 = IR::RegOpnd::New(TyInt32,this->m_func);
  if ((pIVar8->super_Opnd).m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb76,"(divisor->GetType() == TyInt32)","divisor->GetType() == TyInt32");
    if (!bVar3) {
LAB_00649908:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  divisor = -uVar5;
  if (0 < (int)uVar5) {
    divisor = uVar5;
  }
  if (divisor + 0x80000001 < 0x80000002) {
LAB_00649645:
    bVar3 = false;
  }
  else {
    if (divisor == 1) {
      this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar3 = JITTimeFunctionBody::IsWasmFunction(this_00);
      if (((int)uVar5 < 0) && (bVar3)) goto LAB_00649645;
      Lowerer::InsertMove(dst,src1,instrDiv,true);
    }
    else if ((divisor + 0x7fffffff & divisor) == 0) {
      uVar1 = 0x1f;
      if (divisor != 0) {
        for (; divisor >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      pIVar8 = IR::IntConstOpnd::New((ulong)((uVar1 ^ 0xffffffe0) + 0x1f),TyInt8,this->m_func,false)
      ;
      Lowerer::InsertShift(Shr_A,false,&dst_00->super_Opnd,src1,&pIVar8->super_Opnd,instrDiv);
      pIVar8 = IR::IntConstOpnd::New((ulong)(0x20 - uVar1),TyInt8,this->m_func,false);
      Lowerer::InsertShift
                (ShrU_A,false,&dst_00->super_Opnd,&dst_00->super_Opnd,&pIVar8->super_Opnd,instrDiv);
      Lowerer::InsertAdd(false,&dst_00->super_Opnd,&dst_00->super_Opnd,src1,instrDiv);
      pIVar8 = IR::IntConstOpnd::New((ulong)uVar1,TyInt8,this->m_func,false);
      Lowerer::InsertShift(Shr_A,false,dst,&dst_00->super_Opnd,&pIVar8->super_Opnd,instrDiv);
    }
    else {
      DVar9 = Js::NumberUtilities::GenerateDivMagicNumber(divisor);
      pRVar7 = IR::RegOpnd::New(TyInt64,this->m_func);
      dst_01 = IR::RegOpnd::New(TyInt64,this->m_func);
      Lowerer::InsertMove(&dst_01->super_Opnd,src1,instrDiv,true);
      pIVar8 = IR::IntConstOpnd::New((long)DVar9.multiplier,TyInt32,this->m_func,false);
      instr = IR::Instr::New(IMUL2,&pRVar7->super_Opnd,&pIVar8->super_Opnd,&dst_01->super_Opnd,
                             this->m_func);
      IR::Instr::InsertBefore(instrDiv,instr);
      LowererMD::Legalize<false>(instr,false);
      pIVar8 = IR::IntConstOpnd::New(0x20,TyInt8,this->m_func,false);
      Lowerer::InsertShift
                (Shr_A,false,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar8->super_Opnd,instrDiv);
      Lowerer::InsertMove(&dst_00->super_Opnd,&pRVar7->super_Opnd,instrDiv,true);
      if (DVar9.multiplier < 0) {
        Lowerer::InsertAdd(false,&dst_00->super_Opnd,&dst_00->super_Opnd,src1,instrDiv);
      }
      value = DVar9._0_8_ >> 0x20;
      if (value != 0) {
        pIVar8 = IR::IntConstOpnd::New(value,TyInt8,this->m_func,false);
        Lowerer::InsertShift
                  (Shr_A,false,&dst_00->super_Opnd,&dst_00->super_Opnd,&pIVar8->super_Opnd,instrDiv)
        ;
      }
      pRVar7 = IR::RegOpnd::New(TyInt32,this->m_func);
      Lowerer::InsertMove(&pRVar7->super_Opnd,src1,instrDiv,true);
      pIVar8 = IR::IntConstOpnd::New(0x1f,TyInt8,this->m_func,false);
      Lowerer::InsertShift
                (ShrU_A,false,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar8->super_Opnd,instrDiv);
      Lowerer::InsertAdd(false,dst,&dst_00->super_Opnd,&pRVar7->super_Opnd,instrDiv);
    }
    bVar3 = true;
    if ((int)uVar5 < 0) {
      pIVar8 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      Lowerer::InsertSub(false,dst,&pIVar8->super_Opnd,dst,instrDiv);
    }
  }
  return bVar3;
}

Assistant:

bool LowererMDArch::GenerateFastDivAndRem_Signed(IR::Instr* instrDiv)
{
    Assert(instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4);

    IR::Opnd* divident  = instrDiv->GetSrc1(); // nominator
    IR::Opnd* divisor   = instrDiv->GetSrc2(); // denominator
    IR::Opnd* dst       = instrDiv->GetDst();
    int constDivisor    = divisor->AsIntConstOpnd()->AsInt32();
    IR::Opnd* result = IR::RegOpnd::New(TyInt32, this->m_func);

    bool isNegDevisor   = false;

    Assert(divisor->GetType() == TyInt32); // constopnd->AsInt32() currently does silent casts between int32 and uint32

    if (constDivisor < 0)
    {
        isNegDevisor = true;
        constDivisor *= -1;
    }

    if (constDivisor <= 0 || constDivisor > INT32_MAX - 1)
    {
        return false;
    }
    if (constDivisor == 1)
    {
        // Wasm expects x/-1 not to be folded to -x.
        if (m_func->GetJITFunctionBody()->IsWasmFunction() && isNegDevisor == true)
        {
            return false;
        }
        Lowerer::InsertMove(dst, divident, instrDiv);
    }
    else if (Math::IsPow2(constDivisor)) // Power of two
    {
        // Negative dividents needs the result incremented by 1
        // Following sequence avoids branch
        // For q = n/d and d = 2^k

        //      sar q n k-1   //2^(k-1) if n < 0 else 0
        //      shr q q 32-k
        //      add q q n
        //      sar q q k

        int k = Math::Log2(constDivisor);
        Lowerer::InsertShift(Js::OpCode::Shr_A, false, result, divident, IR::IntConstOpnd::New(k - 1, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertShift(Js::OpCode::ShrU_A, false, result, result, IR::IntConstOpnd::New(32 - k, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertAdd(false, result, result, divident, instrDiv);
        Lowerer::InsertShift(Js::OpCode::Shr_A, false, dst, result, IR::IntConstOpnd::New(k, TyInt8, this->m_func), instrDiv);
    }
    else
    {
        // Ref: Warren's Hacker's Delight, Chapter 10
        //
        // For q = n/d where d is a signed constant
        // Calculate magic_number (multiplier) and shift amounts (shiftAmt) and replace  div with mul and shift

        Js::NumberUtilities::DivMagicNumber magic_number(Js::NumberUtilities::GenerateDivMagicNumber(constDivisor));
        int32 multiplier = magic_number.multiplier;

        // Compute mulhs divident, multiplier
        IR::Opnd* quotient64reg = IR::RegOpnd::New(TyInt64, this->m_func);
        IR::Opnd* divident64Reg = IR::RegOpnd::New(TyInt64, this->m_func);

        Lowerer::InsertMove(divident64Reg, divident, instrDiv);
        IR::Instr* imul = IR::Instr::New(LowererMD::MDImulOpcode, quotient64reg, IR::IntConstOpnd::New(multiplier, TyInt32, this->m_func), divident64Reg, this->m_func);
        instrDiv->InsertBefore(imul);
        LowererMD::Legalize(imul);

        Lowerer::InsertShift(Js::OpCode::Shr_A, false, quotient64reg, quotient64reg, IR::IntConstOpnd::New(32, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertMove(result, quotient64reg, instrDiv);

        // Special handling when divisor is of type 5 and 7.
        if (multiplier < 0)
        {
            Lowerer::InsertAdd(false, result, result, divident, instrDiv);
        }
        if (magic_number.shiftAmt > 0)
        {
            Lowerer::InsertShift(Js::OpCode::Shr_A, false, result, result, IR::IntConstOpnd::New(magic_number.shiftAmt, TyInt8, this->m_func), instrDiv);
        }
        IR::Opnd* tmpReg2 = IR::RegOpnd::New(TyInt32, this->m_func);
        Lowerer::InsertMove(tmpReg2, divident, instrDiv);

        // Add 1 if divisor is less than 0
        Lowerer::InsertShift(Js::OpCode::ShrU_A, false, tmpReg2, tmpReg2, IR::IntConstOpnd::New(31, TyInt8, this->m_func), instrDiv); // 1 if divident < 0, 0 otherwise
        Lowerer::InsertAdd(false, dst, result, tmpReg2, instrDiv);
    }

    // Negate results if divident is less than zero
    if (isNegDevisor)
    {
        Lowerer::InsertSub(false, dst, IR::IntConstOpnd::New(0, TyInt8, this->m_func), dst, instrDiv);
    }
    return true;
}